

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O0

UDataSwapper *
udata_openSwapperForInputData_63
          (void *data,int32_t length,UBool outIsBigEndian,uint8_t outCharset,UErrorCode *pErrorCode)

{
  char inIsBigEndian_00;
  uint8_t inCharset_00;
  UBool UVar1;
  UDataSwapper *pUVar2;
  ushort local_34;
  ushort local_32;
  int8_t inCharset;
  UBool inIsBigEndian;
  uint16_t infoSize;
  uint16_t headerSize;
  DataHeader *pHeader;
  UErrorCode *pErrorCode_local;
  uint8_t outCharset_local;
  UBool outIsBigEndian_local;
  int32_t length_local;
  void *data_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    return (UDataSwapper *)0x0;
  }
  if ((data == (void *)0x0) || (((-1 < length && (length < 0x18)) || (1 < outCharset)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UDataSwapper *)0x0;
  }
  if (((-1 < length) && (length < 0x18)) ||
     ((*(char *)((long)data + 2) != -0x26 ||
      ((*(char *)((long)data + 3) != '\'' || (*(char *)((long)data + 10) != '\x02')))))) {
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return (UDataSwapper *)0x0;
  }
  inIsBigEndian_00 = *(char *)((long)data + 8);
  inCharset_00 = *(uint8_t *)((long)data + 9);
  if (inIsBigEndian_00 == '\0') {
    local_32 = *data;
    local_34 = *(ushort *)((long)data + 4);
  }
  else {
    local_32 = uprv_readSwapUInt16(*data);
    local_34 = uprv_readSwapUInt16(*(uint16_t *)((long)data + 4));
  }
  if ((((0x17 < local_32) && (0x13 < local_34)) && ((ulong)local_34 + 4 <= (ulong)local_32)) &&
     ((length < 0 || ((int)(uint)local_32 <= length)))) {
    pUVar2 = udata_openSwapper_63
                       (inIsBigEndian_00,inCharset_00,outIsBigEndian,outCharset,pErrorCode);
    return pUVar2;
  }
  *pErrorCode = U_UNSUPPORTED_ERROR;
  return (UDataSwapper *)0x0;
}

Assistant:

U_CAPI UDataSwapper * U_EXPORT2
udata_openSwapperForInputData(const void *data, int32_t length,
                              UBool outIsBigEndian, uint8_t outCharset,
                              UErrorCode *pErrorCode) {
    const DataHeader *pHeader;
    uint16_t headerSize, infoSize;
    UBool inIsBigEndian;
    int8_t inCharset;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( data==NULL ||
        (length>=0 && length<(int32_t)sizeof(DataHeader)) ||
        outCharset>U_EBCDIC_FAMILY
    ) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    pHeader=(const DataHeader *)data;
    if( (length>=0 && length<(int32_t)sizeof(DataHeader)) ||
        pHeader->dataHeader.magic1!=0xda ||
        pHeader->dataHeader.magic2!=0x27 ||
        pHeader->info.sizeofUChar!=2
    ) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inIsBigEndian=(UBool)pHeader->info.isBigEndian;
    inCharset=pHeader->info.charsetFamily;

    if(inIsBigEndian==U_IS_BIG_ENDIAN) {
        headerSize=pHeader->dataHeader.headerSize;
        infoSize=pHeader->info.size;
    } else {
        headerSize=uprv_readSwapUInt16(pHeader->dataHeader.headerSize);
        infoSize=uprv_readSwapUInt16(pHeader->info.size);
    }

    if( headerSize<sizeof(DataHeader) ||
        infoSize<sizeof(UDataInfo) ||
        headerSize<(sizeof(pHeader->dataHeader)+infoSize) ||
        (length>=0 && length<headerSize)
    ) {
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    return udata_openSwapper(inIsBigEndian, inCharset, outIsBigEndian, outCharset, pErrorCode);
}